

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::ashrSlowCase(APInt *this,uint ShiftAmt)

{
  uint64_t *puVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t uVar8;
  sbyte sVar9;
  uint local_28;
  uint i;
  uint WordsToMove;
  uint BitShift;
  uint WordShift;
  bool Negative;
  uint ShiftAmt_local;
  APInt *this_local;
  
  if (ShiftAmt != 0) {
    bVar2 = isNegative(this);
    uVar4 = ShiftAmt >> 6;
    uVar5 = ShiftAmt & 0x3f;
    uVar6 = getNumWords(this);
    uVar6 = uVar6 - uVar4;
    if (uVar6 != 0) {
      puVar1 = (this->U).pVal;
      uVar7 = getNumWords(this);
      uVar8 = SignExtend64(puVar1[uVar7 - 1],(this->BitWidth - 1 & 0x3f) + 1);
      puVar1 = (this->U).pVal;
      uVar7 = getNumWords(this);
      puVar1[uVar7 - 1] = uVar8;
      if (uVar5 == 0) {
        memmove((this->U).pVal,(this->U).pVal + uVar4,(ulong)(uVar6 * 8));
      }
      else {
        for (local_28 = 0; sVar9 = (sbyte)uVar5, local_28 != uVar6 - 1; local_28 = local_28 + 1) {
          (this->U).pVal[local_28] =
               (this->U).pVal[local_28 + uVar4] >> sVar9 |
               (this->U).pVal[local_28 + uVar4 + 1] << (0x40U - sVar9 & 0x3f);
        }
        (this->U).pVal[uVar6 - 1] = (this->U).pVal[(uVar4 + uVar6) - 1] >> sVar9;
        uVar8 = SignExtend64((this->U).pVal[uVar6 - 1],0x40 - uVar5);
        (this->U).pVal[uVar6 - 1] = uVar8;
      }
    }
    bVar3 = 0;
    if (bVar2) {
      bVar3 = 0xff;
    }
    memset((this->U).pVal + uVar6,(uint)bVar3,(ulong)(uVar4 << 3));
    clearUnusedBits(this);
  }
  return;
}

Assistant:

void APInt::ashrSlowCase(unsigned ShiftAmt) {
  // Don't bother performing a no-op shift.
  if (!ShiftAmt)
    return;

  // Save the original sign bit for later.
  bool Negative = isNegative();

  // WordShift is the inter-part shift; BitShift is intra-part shift.
  unsigned WordShift = ShiftAmt / APINT_BITS_PER_WORD;
  unsigned BitShift = ShiftAmt % APINT_BITS_PER_WORD;

  unsigned WordsToMove = getNumWords() - WordShift;
  if (WordsToMove != 0) {
    // Sign extend the last word to fill in the unused bits.
    U.pVal[getNumWords() - 1] = SignExtend64(
        U.pVal[getNumWords() - 1], ((BitWidth - 1) % APINT_BITS_PER_WORD) + 1);

    // Fastpath for moving by whole words.
    if (BitShift == 0) {
      std::memmove(U.pVal, U.pVal + WordShift, WordsToMove * APINT_WORD_SIZE);
    } else {
      // Move the words containing significant bits.
      for (unsigned i = 0; i != WordsToMove - 1; ++i)
        U.pVal[i] = (U.pVal[i + WordShift] >> BitShift) |
                    (U.pVal[i + WordShift + 1] << (APINT_BITS_PER_WORD - BitShift));

      // Handle the last word which has no high bits to copy.
      U.pVal[WordsToMove - 1] = U.pVal[WordShift + WordsToMove - 1] >> BitShift;
      // Sign extend one more time.
      U.pVal[WordsToMove - 1] =
          SignExtend64(U.pVal[WordsToMove - 1], APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder based on the original sign.
  std::memset(U.pVal + WordsToMove, Negative ? -1 : 0,
              WordShift * APINT_WORD_SIZE);
  clearUnusedBits();
}